

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

Array2D<float> *
pbrt::Sample2DFunction
          (function<float_(float,_float)> *f,int nu,int nv,int nSamples,Bounds2f domain,
          Allocator alloc)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Tuple2<pbrt::Point2,_float> *pTVar3;
  size_type sVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int __x;
  Array2D<float> *in_RDI;
  int in_R8D;
  undefined8 in_R9;
  Point2<float> PVar5;
  undefined8 extraout_XMM0_Qb;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  Float fuv;
  Point2f p;
  size_t i_1;
  double accum;
  int u;
  int v;
  int i;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> samples;
  Array2D<float> *values;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  function<float_(float,_float)> *in_stack_fffffffffffffeb0;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  size_type in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  allocator_type in_stack_fffffffffffffee0;
  double local_d0;
  float local_c4;
  undefined8 local_b8;
  ulong local_b0;
  double local_a8;
  int local_a0;
  int local_9c;
  undefined8 local_98;
  undefined1 local_89;
  Tuple2<pbrt::Point2,_float> local_70;
  int local_68;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_50;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = vmovlpd_avx(in_ZMM0._0_16_);
  local_10 = vmovlpd_avx(in_ZMM1._0_16_);
  local_34 = in_R8D;
  local_30 = in_ECX;
  local_2c = in_EDX;
  local_20 = in_R9;
  std::allocator<pbrt::Point2<float>_>::allocator((allocator<pbrt::Point2<float>_> *)0xa382ab);
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
             ,(allocator_type *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::allocator<pbrt::Point2<float>_>::~allocator((allocator<pbrt::Point2<float>_> *)0xa382d4);
  for (local_68 = 0; local_68 < local_34; local_68 = local_68 + 1) {
    RadicalInverse((int)((ulong)in_stack_fffffffffffffee0.memoryResource >> 0x20),
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    RadicalInverse((int)((ulong)in_stack_fffffffffffffee0.memoryResource >> 0x20),
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    Point2<float>::Point2
              ((Point2<float> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
               in_stack_fffffffffffffea8);
    pTVar3 = &std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::operator[]
                        (&local_50,(long)local_68)->super_Tuple2<pbrt::Point2,_float>;
    *pTVar3 = local_70;
  }
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
             in_stack_fffffffffffffea8);
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::push_back
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             in_stack_fffffffffffffeb0,
             (value_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
             in_stack_fffffffffffffea8);
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::push_back
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             in_stack_fffffffffffffeb0,
             (value_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
             in_stack_fffffffffffffea8);
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::push_back
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             in_stack_fffffffffffffeb0,
             (value_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_89 = 0;
  local_98 = local_20;
  Array2D<float>::Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,in_stack_fffffffffffffee0);
  for (local_9c = 0; local_9c < local_30; local_9c = local_9c + 1) {
    for (local_a0 = 0; local_a0 < local_2c; local_a0 = local_a0 + 1) {
      local_a8 = 0.0;
      for (local_b0 = 0; uVar2 = local_b0,
          sVar4 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::size
                            (&local_50), uVar2 < sVar4; local_b0 = local_b0 + 1) {
        pTVar3 = &std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::
                  operator[](&local_50,local_b0)->super_Tuple2<pbrt::Point2,_float>;
        Tuple2<pbrt::Point2,_float>::operator[](pTVar3,0);
        pTVar3 = &std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::
                  operator[](&local_50,local_b0)->super_Tuple2<pbrt::Point2,_float>;
        Tuple2<pbrt::Point2,_float>::operator[](pTVar3,1);
        Point2<float>::Point2
                  ((Point2<float> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
                   in_stack_fffffffffffffea8);
        PVar5 = Bounds2<float>::Lerp
                          ((Bounds2<float> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
        auVar1._8_4_ = (int)extraout_XMM0_Qb;
        auVar1._0_4_ = PVar5.super_Tuple2<pbrt::Point2,_float>.x;
        auVar1._4_4_ = PVar5.super_Tuple2<pbrt::Point2,_float>.y;
        auVar1._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        local_b8 = vmovlpd_avx(auVar1);
        __x = in_ESI;
        in_stack_fffffffffffffec0 =
             std::function<float_(float,_float)>::operator()
                       (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
                        in_stack_fffffffffffffea8);
        in_stack_fffffffffffffec4 = in_stack_fffffffffffffec0;
        std::abs(__x);
        local_d0 = (double)in_stack_fffffffffffffec0;
        local_c4 = in_stack_fffffffffffffec0;
        in_stack_fffffffffffffeb8 =
             (Tuple2<pbrt::Point2,_float>)std::max<double>(&local_a8,&local_d0);
        local_a8 = *(double *)in_stack_fffffffffffffeb8;
      }
      in_stack_fffffffffffffeac = (float)local_a8;
      in_stack_fffffffffffffeb0 =
           (function<float_(float,_float)> *)
           Array2D<float>::operator()
                     ((Array2D<float> *)
                      CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      (int)in_stack_fffffffffffffeb8.y,(int)in_stack_fffffffffffffeb8.x);
      *(float *)&(in_stack_fffffffffffffeb0->super__Function_base)._M_functor =
           in_stack_fffffffffffffeac;
    }
  }
  local_89 = 1;
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~vector
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  return in_RDI;
}

Assistant:

Array2D<Float> Sample2DFunction(std::function<Float(Float, Float)> f, int nu, int nv,
                                int nSamples, Bounds2f domain, Allocator alloc) {
    std::vector<Point2f> samples(nSamples);
    for (int i = 0; i < nSamples; ++i)
        samples[i] = Point2f(RadicalInverse(0, i), RadicalInverse(1, i));
    // Check the corners, too.
    samples.push_back(Point2f(0, 1));
    samples.push_back(Point2f(1, 0));
    samples.push_back(Point2f(1, 1));

    Array2D<Float> values(nu, nv, alloc);
    for (int v = 0; v < nv; ++v) {
        for (int u = 0; u < nu; ++u) {
            double accum = 0;
            for (size_t i = 0; i < samples.size(); ++i) {
                Point2f p = domain.Lerp(
                    Point2f((u + samples[i][0]) / nu, (v + samples[i][1]) / nv));
                Float fuv = std::abs(f(p.x, p.y));
                accum = std::max<double>(accum, fuv);
            }
            // There's actually no need for the divide by nSamples, since
            // these are normalzed into a PDF anyway.
            values(u, v) = accum;
        }
    }

    return values;
}